

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreSimplify.cpp
# Opt level: O3

void mathCore::DeMorgansD(expression *a)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  
  bVar1 = is_and(a);
  if (bVar1) {
    dual(a);
    trans_or(a);
    for (p_Var2 = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(a->contents)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      dual(*(expression **)(p_Var2 + 1));
    }
  }
  else {
    bVar1 = is_or(a);
    if (bVar1) {
      dual(a);
      trans_and(a);
      for (p_Var2 = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &(a->contents)._M_t._M_impl.super__Rb_tree_header;
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
        dual(*(expression **)(p_Var2 + 1));
      }
    }
  }
  return;
}

Assistant:

void mathCore::DeMorgansD(expression* a) {
	if (mathCore::is_and(a)) {
		dual(a);
		trans_or(a);
		for (auto child : a->contents) {
			dual(child);
		}
	}
	else if (mathCore::is_or(a)) {
		dual(a);
		trans_and(a);
		for (auto child : a->contents) {
			dual(child);
		}
	}
}